

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

ssize_t __thiscall higan::Buffer::ReadFromFd(Buffer *this,int fd)

{
  int __count;
  size_t sVar1;
  Buffer *pBVar2;
  size_t index;
  ssize_t ex_len;
  ssize_t read_size;
  undefined1 auStack_10048 [4];
  int iov_count;
  iovec iovec_temp [2];
  char exbuffer [65535];
  int fd_local;
  Buffer *this_local;
  
  memset(auStack_10048,0,0x20);
  _auStack_10048 = WriteBegin(this);
  iovec_temp[0].iov_base = (void *)WritableSize(this);
  iovec_temp[0].iov_len = (size_t)&iovec_temp[1].iov_len;
  iovec_temp[1].iov_base = (void *)0xffff;
  sVar1 = WritableSize(this);
  __count = 2;
  if (0xfffe < sVar1) {
    __count = 1;
  }
  this_local = (Buffer *)readv(fd,(iovec *)auStack_10048,__count);
  if ((long)this_local < 0) {
    this_local = (Buffer *)0xffffffffffffffff;
  }
  else {
    pBVar2 = (Buffer *)WritableSize(this);
    if (pBVar2 < this_local) {
      sVar1 = WritableSize(this);
      index = WritableSize(this);
      AddWriteIndex(this,index);
      CopyExDataToBuffer(this,(char *)&iovec_temp[1].iov_len,(long)this_local - sVar1);
    }
    else {
      AddWriteIndex(this,(size_t)this_local);
    }
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t Buffer::ReadFromFd(int fd)
{
	char exbuffer[MAX_EX_BUFFER_SIZE];

	iovec iovec_temp[2]{};
	iovec_temp[0].iov_base = WriteBegin();
	iovec_temp[0].iov_len = WritableSize();
	iovec_temp[1].iov_base = exbuffer;
	iovec_temp[1].iov_len = MAX_EX_BUFFER_SIZE;

	int iov_count = WritableSize() >= MAX_EX_BUFFER_SIZE ? 1 : 2;
	ssize_t read_size = readv(fd, iovec_temp, iov_count);

	if (read_size < 0)
	{
		return -1;
	}
	else if (static_cast<size_t>(read_size) <= WritableSize())
	{
		AddWriteIndex(read_size);
	}
	else
	{
		/**
		 * 先处理读入buffer_部分的数据 再处理exbuff中的内容
		 */
		ssize_t ex_len = read_size - WritableSize();
		AddWriteIndex(WritableSize());
		CopyExDataToBuffer(exbuffer, ex_len);
	}

	return read_size;
}